

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

void __thiscall spectest::CommandRunner::CommandRunner(CommandRunner *this)

{
  _Rb_tree_header *p_Var1;
  u64 uVar2;
  mapped_type *this_00;
  CommandRunner *store;
  _func_void *p_Var3;
  mapped_type *pmVar4;
  ExternKind EVar5;
  long lVar6;
  anon_struct_72_2_3f8ecaa8 *paVar7;
  undefined4 local_554;
  mapped_type *local_550;
  CommandRunner *local_548;
  string import_name;
  key_type local_520;
  anon_union_16_6_113bff37_for_Value_0 local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  anon_struct_72_2_3f8ecaa8 local_4e0;
  _Any_data local_498;
  code *local_488;
  code *pcStack_480;
  Ptr local_470;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_458;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_438;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_418;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_3f8;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_3d8;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_3b8;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_398;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_378;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_338;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  GlobalType local_2d8;
  GlobalType local_2c0;
  GlobalType local_2a8;
  GlobalType local_290;
  MemoryType local_278;
  TableType local_250;
  anon_struct_72_2_3f8ecaa8 print_funcs [6];
  FuncType local_70;
  
  wabt::interp::Store::Store(&this->store_,&s_features);
  p_Var1 = &(this->registry_)._M_t._M_impl.super__Rb_tree_header;
  (this->registry_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->registry_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->registry_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->registry_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->registry_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->instances_)._M_t._M_impl.super__Rb_tree_header;
  (this->instances_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->instances_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->instances_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->instances_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->instances_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->last_instance_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->last_instance_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->last_instance_)._M_t._M_impl.super__Rb_tree_header;
  (this->last_instance_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->last_instance_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->last_instance_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->passed_ = 0;
  this->total_ = 0;
  (this->source_filename_)._M_dataplus._M_p = (pointer)&(this->source_filename_).field_2;
  (this->source_filename_)._M_string_length = 0;
  (this->source_filename_).field_2._M_local_buf[0] = '\0';
  local_548 = this;
  std::__cxx11::string::string((string *)print_funcs,"spectest",(allocator *)&local_500.v128_);
  local_550 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>_>_>_>
              ::operator[](&this->registry_,(key_type *)print_funcs);
  std::__cxx11::string::_M_dispose();
  print_funcs[0].name = "print";
  local_398._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_398._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wabt::interp::FuncType::FuncType
            (&print_funcs[0].type,(ValueTypes *)&local_398,(ValueTypes *)&local_3b8);
  print_funcs[1].name = "print_i32";
  local_520._M_dataplus._M_p._0_4_ = 0xffffffff;
  local_3d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_3d8,&local_520);
  local_3f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wabt::interp::FuncType::FuncType
            (&print_funcs[1].type,(ValueTypes *)&local_3d8,(ValueTypes *)&local_3f8);
  print_funcs[2].name = "print_f32";
  local_470.obj_._0_4_ = 0xfffffffd;
  local_418._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_418,&local_470);
  local_438._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_438._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wabt::interp::FuncType::FuncType
            (&print_funcs[2].type,(ValueTypes *)&local_418,(ValueTypes *)&local_438);
  print_funcs[3].name = "print_f64";
  local_554 = 0xfffffffc;
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_2e8 = 0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_2f8,&local_554);
  local_458._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_458._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wabt::interp::FuncType::FuncType
            (&print_funcs[3].type,(ValueTypes *)&local_2f8,(ValueTypes *)&local_458);
  print_funcs[4].name = "print_i32_f32";
  local_500.i32_ = 0xffffffff;
  local_500.i64_._4_4_ = 0xfffffffd;
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_318,&local_500,
             local_500.v128_.v + 8);
  local_338._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wabt::interp::FuncType::FuncType
            (&print_funcs[4].type,(ValueTypes *)&local_318,(ValueTypes *)&local_338);
  print_funcs[5].name = "print_f64_f64";
  import_name._M_dataplus._M_p = (pointer)0xfffffffcfffffffc;
  local_358 = 0;
  uStack_350 = 0;
  local_348 = 0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_358,&import_name);
  local_378._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wabt::interp::FuncType::FuncType
            (&print_funcs[5].type,(ValueTypes *)&local_358,(ValueTypes *)&local_378);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_378);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_358);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_338);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_318);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_458);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_2f8);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_438);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_418);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_3f8);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_3d8);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_3b8);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_398);
  for (lVar6 = 0; store = local_548, lVar6 != 0x1b0; lVar6 = lVar6 + 0x48) {
    paVar7 = (anon_struct_72_2_3f8ecaa8 *)((long)&print_funcs[0].name + lVar6);
    wabt::StringPrintf_abi_cxx11_(&import_name,"spectest.%s",paVar7->name);
    wabt::interp::FuncType::FuncType
              (&local_70,
               (FuncType *)((long)&print_funcs[0].type.super_ExternType._vptr_ExternType + lVar6));
    std::__cxx11::string::string((string *)&local_500.v128_,(string *)&import_name);
    CommandRunner()::$_1::__1((__1 *)&local_4e0,paVar7);
    local_488 = (code *)0x0;
    pcStack_480 = (code *)0x0;
    local_498._M_unused._M_object = (void *)0x0;
    local_498._8_8_ = 0;
    p_Var3 = (_func_void *)operator_new(0x68);
    *(_func_void **)p_Var3 = p_Var3 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500.i64_ == &local_4f0) {
      *(u64 *)(p_Var3 + 0x10) =
           CONCAT44(local_4f0._M_allocated_capacity._4_4_,local_4f0._M_allocated_capacity._0_4_);
      *(undefined8 *)(p_Var3 + 0x18) = local_4f0._8_8_;
    }
    else {
      *(u64 *)p_Var3 = local_500.i64_;
      *(u64 *)(p_Var3 + 0x10) =
           CONCAT44(local_4f0._M_allocated_capacity._4_4_,local_4f0._M_allocated_capacity._0_4_);
    }
    uVar2 = CONCAT44(local_500._12_4_,local_500._8_4_);
    local_500._8_4_ = 0;
    local_500._12_4_ = 0;
    *(u64 *)(p_Var3 + 8) = uVar2;
    local_4f0._M_allocated_capacity._0_4_ = local_4f0._M_allocated_capacity._0_4_ & 0xffffff00;
    local_500.i64_ = (u64)&local_4f0;
    CommandRunner()::$_1::__1((__1 *)(p_Var3 + 0x20),&local_4e0);
    pcStack_480 = std::
                  _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/spectest-interp.cc:1225:9)>
                  ::_M_invoke;
    local_488 = std::
                _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/spectest-interp.cc:1225:9)>
                ::_M_manager;
    local_498._M_unused._0_8_ = p_Var3;
    wabt::interp::HostFunc::New(&local_470,&local_548->store_,&local_70,(Callback *)&local_498);
    std::__cxx11::string::string((string *)&local_520,paVar7->name,(allocator *)&local_554);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
             ::operator[](local_550,&local_520);
    wabt::interp::RefPtr<wabt::interp::Extern>::operator=(pmVar4,&local_470);
    std::__cxx11::string::_M_dispose();
    wabt::interp::RefPtr<wabt::interp::HostFunc>::reset(&local_470);
    if (local_488 != (code *)0x0) {
      (*local_488)(&local_498,&local_498,__destroy_functor);
    }
    CommandRunner()::$_0::~__0((__0 *)&local_500.v128_);
    wabt::interp::FuncType::~FuncType(&local_70);
    std::__cxx11::string::_M_dispose();
  }
  local_250.super_ExternType.kind = Table;
  local_250.super_ExternType._12_4_ = 0xfffffff0;
  local_250.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00232470;
  local_250.limits.initial = 10;
  local_250.limits.max = 0x14;
  local_250.limits.has_max = true;
  local_250.limits.is_shared = false;
  local_250.limits.is_64 = false;
  wabt::interp::Table::New((Ptr *)&import_name,&local_548->store_,&local_250);
  std::__cxx11::string::string((string *)&local_500.v128_,"table",(allocator *)&local_520);
  this_00 = local_550;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](local_550,(key_type *)&local_500.v128_);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=
            (pmVar4,(RefPtr<wabt::interp::Table> *)&import_name);
  std::__cxx11::string::_M_dispose();
  wabt::interp::RefPtr<wabt::interp::Table>::reset((RefPtr<wabt::interp::Table> *)&import_name);
  local_278.super_ExternType.kind = Memory;
  local_278.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002324b0;
  local_278.limits.initial = 1;
  local_278.limits.max = 2;
  local_278.limits.has_max = true;
  local_278.limits.is_shared = false;
  local_278.limits.is_64 = false;
  wabt::interp::Memory::New((Ptr *)&import_name,&store->store_,&local_278);
  std::__cxx11::string::string((string *)&local_500.v128_,"memory",(allocator *)&local_520);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](this_00,(key_type *)&local_500.v128_);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=
            (pmVar4,(RefPtr<wabt::interp::Memory> *)&import_name);
  std::__cxx11::string::_M_dispose();
  wabt::interp::RefPtr<wabt::interp::Memory>::reset((RefPtr<wabt::interp::Memory> *)&import_name);
  EVar5 = Global;
  local_290.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002324f0;
  local_290.super_ExternType._12_4_ = 0xffffffff;
  local_290.mut = Const;
  local_500._12_4_ = 0;
  local_4f0._M_allocated_capacity._0_4_ = 0xffffffff;
  local_500.i64_._4_4_ = 0;
  local_500._8_4_ = 0;
  local_500.i32_ = 0x29a;
  local_290.super_ExternType.kind = EVar5;
  wabt::interp::Store::
  Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
            ((RefPtr<wabt::interp::Global> *)&import_name,&store->store_,&store->store_,&local_290,
             (Value *)&local_500.v128_);
  std::__cxx11::string::string((string *)&local_500.v128_,"global_i32",(allocator *)&local_520);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](this_00,(key_type *)&local_500.v128_);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=
            (pmVar4,(RefPtr<wabt::interp::Global> *)&import_name);
  std::__cxx11::string::_M_dispose();
  wabt::interp::RefPtr<wabt::interp::Global>::reset((RefPtr<wabt::interp::Global> *)&import_name);
  local_2a8.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002324f0;
  local_2a8.super_ExternType._12_4_ = 0xfffffffe;
  local_2a8.mut = Const;
  local_500.i32_ = 0x29a;
  local_500.i64_._4_4_ = 0;
  local_500._8_4_ = 0;
  local_500._12_4_ = 0;
  local_4f0._M_allocated_capacity._0_4_ = 0xfffffffe;
  local_2a8.super_ExternType.kind = EVar5;
  wabt::interp::Store::
  Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
            ((RefPtr<wabt::interp::Global> *)&import_name,&store->store_,&store->store_,&local_2a8,
             (Value *)&local_500.v128_);
  std::__cxx11::string::string((string *)&local_500.v128_,"global_i64",(allocator *)&local_520);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](this_00,(key_type *)&local_500.v128_);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=
            (pmVar4,(RefPtr<wabt::interp::Global> *)&import_name);
  std::__cxx11::string::_M_dispose();
  wabt::interp::RefPtr<wabt::interp::Global>::reset((RefPtr<wabt::interp::Global> *)&import_name);
  local_2c0.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002324f0;
  local_2c0.super_ExternType._12_4_ = 0xfffffffd;
  local_2c0.mut = Const;
  local_500._12_4_ = 0;
  local_4f0._M_allocated_capacity._0_4_ = 0xfffffffd;
  local_500.i64_._4_4_ = 0;
  local_500._8_4_ = 0;
  local_500.i32_ = 0x44268000;
  local_2c0.super_ExternType.kind = EVar5;
  wabt::interp::Store::
  Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
            ((RefPtr<wabt::interp::Global> *)&import_name,&store->store_,&store->store_,&local_2c0,
             (Value *)&local_500.v128_);
  std::__cxx11::string::string((string *)&local_500.v128_,"global_f32",(allocator *)&local_520);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](this_00,(key_type *)&local_500.v128_);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=
            (pmVar4,(RefPtr<wabt::interp::Global> *)&import_name);
  std::__cxx11::string::_M_dispose();
  wabt::interp::RefPtr<wabt::interp::Global>::reset((RefPtr<wabt::interp::Global> *)&import_name);
  local_2d8.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002324f0;
  local_2d8.super_ExternType._12_4_ = 0xfffffffc;
  local_2d8.mut = Const;
  local_500.i32_ = 0;
  local_500.i64_._4_4_ = 0x4084d000;
  local_500._8_4_ = 0;
  local_500._12_4_ = 0;
  local_4f0._M_allocated_capacity._0_4_ = 0xfffffffc;
  local_2d8.super_ExternType.kind = EVar5;
  wabt::interp::Store::
  Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
            ((RefPtr<wabt::interp::Global> *)&import_name,&store->store_,&store->store_,&local_2d8,
             (Value *)&local_500.v128_);
  std::__cxx11::string::string((string *)&local_500.v128_,"global_f64",(allocator *)&local_520);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](this_00,(key_type *)&local_500.v128_);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=
            (pmVar4,(RefPtr<wabt::interp::Global> *)&import_name);
  std::__cxx11::string::_M_dispose();
  wabt::interp::RefPtr<wabt::interp::Global>::reset((RefPtr<wabt::interp::Global> *)&import_name);
  lVar6 = 0x170;
  do {
    wabt::interp::FuncType::~FuncType((FuncType *)((long)&print_funcs[0].name + lVar6));
    lVar6 = lVar6 + -0x48;
  } while (lVar6 != -0x40);
  return;
}

Assistant:

CommandRunner::CommandRunner() : store_(s_features) {
  auto&& spectest = registry_["spectest"];

  // Initialize print functions for the spec test.
  struct {
    const char* name;
    interp::FuncType type;
  } const print_funcs[] = {
      {"print", interp::FuncType{{}, {}}},
      {"print_i32", interp::FuncType{{ValueType::I32}, {}}},
      {"print_f32", interp::FuncType{{ValueType::F32}, {}}},
      {"print_f64", interp::FuncType{{ValueType::F64}, {}}},
      {"print_i32_f32", interp::FuncType{{ValueType::I32, ValueType::F32}, {}}},
      {"print_f64_f64", interp::FuncType{{ValueType::F64, ValueType::F64}, {}}},
  };

  for (auto&& print : print_funcs) {
    auto import_name = StringPrintf("spectest.%s", print.name);
    spectest[print.name] = HostFunc::New(
        store_, print.type,
        [=](Thread& inst, const Values& params, Values& results,
            Trap::Ptr* trap) -> wabt::Result {
          printf("called host ");
          WriteCall(s_stdout_stream.get(), import_name, print.type, params,
                    results, *trap);
          return wabt::Result::Ok;
        });
  }

  spectest["table"] =
      interp::Table::New(store_, TableType{ValueType::FuncRef, Limits{10, 20}});

  spectest["memory"] = interp::Memory::New(store_, MemoryType{Limits{1, 2}});

  spectest["global_i32"] = interp::Global::New(
      store_, GlobalType{ValueType::I32, Mutability::Const}, Value::Make(u32{666}));
  spectest["global_i64"] = interp::Global::New(
      store_, GlobalType{ValueType::I64, Mutability::Const}, Value::Make(u64{666}));
  spectest["global_f32"] = interp::Global::New(
      store_, GlobalType{ValueType::F32, Mutability::Const}, Value::Make(f32{666}));
  spectest["global_f64"] = interp::Global::New(
      store_, GlobalType{ValueType::F64, Mutability::Const}, Value::Make(f64{666}));
}